

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O1

uint64_t __thiscall xmrig::OclSharedData::adjustDelay(OclSharedData *this,size_t id)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  uint64_t uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  timespec local_28;
  
  if (this->m_threads < 2) {
    return 0;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar6 = this->m_timestamp;
  this->m_timestamp = lVar3 / 1000000;
  lVar3 = lVar3 / 1000000 - uVar6;
  if (lVar3 != 0) {
    auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar8._0_8_ = lVar3;
    auVar8._12_4_ = 0x45300000;
    dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    sVar1 = this->m_threads;
    auVar10._8_4_ = (int)(sVar1 >> 0x20);
    auVar10._0_8_ = sVar1;
    auVar10._12_4_ = 0x45300000;
    dVar7 = this->m_averageRunTime /
            ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    if (dVar9 < this->m_threshold * dVar7) {
      dVar7 = dVar7 - dVar9;
      uVar4 = (ulong)dVar7;
      uVar4 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      this->m_threshold = 0.75;
      goto LAB_001678ae;
    }
  }
  uVar4 = 0;
LAB_001678ae:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  if (uVar4 == 0) {
    return 0;
  }
  uVar6 = 200;
  if (uVar4 < 400) {
    uVar6 = uVar4;
  }
  if (0 < (long)uVar6) {
    local_28.tv_nsec = uVar6 * 1000000;
    local_28.tv_sec = 0;
    do {
      iVar2 = nanosleep(&local_28,&local_28);
      if (iVar2 != -1) {
        return uVar6;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    return uVar6;
  }
  return uVar6;
}

Assistant:

uint64_t xmrig::OclSharedData::adjustDelay(size_t id)
{
    if (m_threads < 2) {
        return 0;
    }

    const uint64_t t0 = Chrono::steadyMSecs();
    uint64_t delay    = 0;

    {
        std::lock_guard<std::mutex> lock(m_mutex);

        const uint64_t dt = t0 - m_timestamp;
        m_timestamp = t0;

        // The perfect interleaving is when N threads on the same GPU start with T/N interval between each other
        // If a thread starts earlier than 0.75*T/N ms after the previous thread, delay it to restore perfect interleaving
        if ((dt > 0) && (dt < m_threshold * (m_averageRunTime / m_threads))) {
            delay = static_cast<uint64_t>(m_averageRunTime / m_threads - dt);
            m_threshold = 0.75;
        }
    }

    if (delay == 0) {
        return 0;
    }

    if (delay >= 400) {
        delay = 200;
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(delay));

#   ifdef XMRIG_INTERLEAVE_DEBUG
    LOG_WARN("Thread #%zu was paused for %" PRIu64 " ms to adjust interleaving", id, delay);
#   endif

    return delay;
}